

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

int xmlSchemaPValAttr(xmlSchemaParserCtxtPtr ctxt,xmlSchemaBasicItemPtr ownerItem,
                     xmlNodePtr ownerElem,char *name,xmlSchemaTypePtr type,xmlChar **value)

{
  xmlAttrPtr attr_00;
  xmlAttrPtr attr;
  xmlChar **value_local;
  xmlSchemaTypePtr type_local;
  char *name_local;
  xmlNodePtr ownerElem_local;
  xmlSchemaBasicItemPtr ownerItem_local;
  xmlSchemaParserCtxtPtr ctxt_local;
  
  if ((ctxt == (xmlSchemaParserCtxtPtr)0x0) || (type == (xmlSchemaTypePtr)0x0)) {
    if (value != (xmlChar **)0x0) {
      *value = (xmlChar *)0x0;
    }
    ctxt_local._4_4_ = -1;
  }
  else if (type->type == XML_SCHEMA_TYPE_BASIC) {
    attr_00 = xmlSchemaGetPropNode(ownerElem,name);
    if (attr_00 == (xmlAttrPtr)0x0) {
      if (value != (xmlChar **)0x0) {
        *value = (xmlChar *)0x0;
      }
      ctxt_local._4_4_ = 0;
    }
    else {
      ctxt_local._4_4_ = xmlSchemaPValAttrNode(ctxt,ownerItem,attr_00,type,value);
    }
  }
  else {
    if (value != (xmlChar **)0x0) {
      *value = (xmlChar *)0x0;
    }
    xmlSchemaPErr(ctxt,ownerElem,0xbfd,
                  "Internal error: xmlSchemaPValAttr, the given type \'%s\' is not a built-in type.\n"
                  ,type->name,(xmlChar *)0x0);
    ctxt_local._4_4_ = -1;
  }
  return ctxt_local._4_4_;
}

Assistant:

static int
xmlSchemaPValAttr(xmlSchemaParserCtxtPtr ctxt,
		       xmlSchemaBasicItemPtr ownerItem,
		       xmlNodePtr ownerElem,
		       const char *name,
		       xmlSchemaTypePtr type,
		       const xmlChar **value)
{
    xmlAttrPtr attr;

    if ((ctxt == NULL) || (type == NULL)) {
	if (value != NULL)
	    *value = NULL;
	return (-1);
    }
    if (type->type != XML_SCHEMA_TYPE_BASIC) {
	if (value != NULL)
	    *value = NULL;
	xmlSchemaPErr(ctxt, ownerElem,
	    XML_SCHEMAP_INTERNAL,
	    "Internal error: xmlSchemaPValAttr, the given "
	    "type '%s' is not a built-in type.\n",
	    type->name, NULL);
	return (-1);
    }
    attr = xmlSchemaGetPropNode(ownerElem, name);
    if (attr == NULL) {
	if (value != NULL)
	    *value = NULL;
	return (0);
    }
    return (xmlSchemaPValAttrNode(ctxt, ownerItem, attr,
	type, value));
}